

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgExoticQuadrature.hpp
# Opt level: O0

CustomTabulated *
TasGrid::getExoticQuadrature
          (CustomTabulated *__return_storage_ptr__,int num_levels,double shift,
          function<double_(double)> *weight_fn,int num_ref_points,char *description,
          bool is_symmetric)

{
  pointer *this;
  function<double_(double)> local_d8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_b0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_a8;
  allocator<double> local_89;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> weight_fn_vals;
  vector<double,_std::allocator<double>_> ref_points;
  vector<double,_std::allocator<double>_> shifted_weights;
  bool is_symmetric_local;
  char *description_local;
  int num_ref_points_local;
  function<double_(double)> *weight_fn_local;
  double shift_local;
  int num_levels_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &ref_points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &weight_fn_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<double>::allocator(&local_89);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,(long)num_ref_points,&local_89);
  std::allocator<double>::~allocator(&local_89);
  TasGrid::OneDimensionalNodes::getGaussLegendre
            (num_ref_points,
             (vector *)
             &ref_points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector *)
             &weight_fn_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  this = &weight_fn_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  local_a8._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)this);
  local_b0._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::end
                 ((vector<double,_std::allocator<double>_> *)this);
  local_b8._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)local_88);
  std::function<double_(double)>::function(&local_d8,weight_fn);
  std::
  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::function<double(double)>>
            (local_a8,local_b0,local_b8,&local_d8);
  std::function<double_(double)>::~function(&local_d8);
  shiftReferenceWeights
            ((vector<double,_std::allocator<double>_> *)local_88,shift,
             (vector<double,_std::allocator<double>_> *)
             &ref_points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  getShiftedExoticQuadrature
            (__return_storage_ptr__,num_levels,shift,
             (vector<double,_std::allocator<double>_> *)
             &ref_points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)
             &weight_fn_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,description,is_symmetric);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &weight_fn_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &ref_points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

inline TasGrid::CustomTabulated getExoticQuadrature(const int num_levels, const double shift, std::function<double(double)> weight_fn,
                                                    const int num_ref_points, const char* description, const bool is_symmetric = false) {
    std::vector<double> shifted_weights, ref_points, weight_fn_vals(num_ref_points);
    TasGrid::OneDimensionalNodes::getGaussLegendre(num_ref_points, shifted_weights, ref_points);
    std::transform(ref_points.begin(), ref_points.end(), weight_fn_vals.begin(), weight_fn);
    shiftReferenceWeights(weight_fn_vals, shift, shifted_weights);
    return getShiftedExoticQuadrature(num_levels, shift, shifted_weights, ref_points, description, is_symmetric);
}